

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# guess_basis.cc
# Opt level: O0

void ipx::ProcessRemaining
               (Control *control,Model *model,double *weights,
               vector<int,_std::allocator<int>_> *basis,Int *rownumber,int *active)

{
  double dVar1;
  int iVar2;
  bool bVar3;
  reference pvVar4;
  Int *pIVar5;
  Int *pIVar6;
  reference piVar7;
  int *jmatch_00;
  int *cheap_00;
  int *marked_00;
  int *work3_00;
  size_type sVar8;
  ostream *poVar9;
  int iVar10;
  vector<int,_std::allocator<int>_> *in_RCX;
  long in_RDX;
  Model *in_RSI;
  Control *in_RDI;
  long in_R8;
  long in_R9;
  Int i_1;
  bool matched;
  Int j;
  const_iterator __end1;
  const_iterator __begin1;
  vector<int,_std::allocator<int>_> *__range1;
  Int num_failed;
  Int num_matched;
  vector<int,_std::allocator<int>_> work3;
  vector<int,_std::allocator<int>_> work2;
  vector<int,_std::allocator<int>_> work;
  vector<int,_std::allocator<int>_> cheap;
  Int *Ai;
  Int *Ap;
  vector<int,_std::allocator<int>_> marked;
  Int i;
  vector<int,_std::allocator<int>_> jmatch;
  vector<int,_std::allocator<int>_> colperm;
  SparseMatrix *AI;
  Int n;
  Int m;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffd48;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *in_stack_fffffffffffffd50
  ;
  allocator_type *in_stack_fffffffffffffd58;
  allocator_type *in_stack_fffffffffffffd60;
  size_type in_stack_fffffffffffffd68;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffd70;
  allocator_type *in_stack_fffffffffffffd78;
  int *in_stack_fffffffffffffd80;
  int *in_stack_fffffffffffffd88;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffd90;
  undefined8 in_stack_fffffffffffffdb8;
  undefined1 reverse;
  Int *Ap_00;
  double *in_stack_fffffffffffffdc0;
  Int *Ai_00;
  undefined8 in_stack_fffffffffffffdc8;
  Int IVar11;
  string local_1b0 [32];
  string local_190 [36];
  int local_16c;
  undefined1 local_165;
  int local_164;
  int *local_160;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_158;
  undefined1 *local_150;
  int local_144;
  int local_140;
  char (*in_stack_fffffffffffffee8) [33];
  int local_90;
  vector<int,_std::allocator<int>_> local_78;
  undefined1 local_60 [24];
  SparseMatrix *local_48;
  Int local_40;
  Int local_3c;
  long local_38;
  long local_30;
  vector<int,_std::allocator<int>_> *local_28;
  long local_20;
  Model *local_18;
  Control *local_10;
  
  IVar11 = (Int)((ulong)in_stack_fffffffffffffdc8 >> 0x20);
  reverse = (undefined1)((ulong)in_stack_fffffffffffffdb8 >> 0x38);
  local_38 = in_R9;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_3c = Model::rows(in_RSI);
  local_40 = Model::cols(local_18);
  local_48 = Model::AI(local_18);
  Sortperm(IVar11,in_stack_fffffffffffffdc0,(bool)reverse);
  std::allocator<int>::allocator((allocator<int> *)0x81e9bf);
  std::vector<int,_std::allocator<int>_>::vector
            (in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,
             (value_type_conflict2 *)in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
  std::allocator<int>::~allocator((allocator<int> *)0x81e9f3);
  for (local_90 = 0; local_90 < local_3c; local_90 = local_90 + 1) {
    if (-1 < *(int *)(local_30 + (long)local_90 * 4)) {
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_78,(long)local_90);
      *pvVar4 = -2;
    }
  }
  std::allocator<int>::allocator((allocator<int> *)0x81eab6);
  std::vector<int,_std::allocator<int>_>::vector
            (in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,
             (value_type_conflict2 *)in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
  std::allocator<int>::~allocator((allocator<int> *)0x81eaea);
  pIVar5 = SparseMatrix::colptr((SparseMatrix *)0x81eaf7);
  pIVar6 = SparseMatrix::rowidx((SparseMatrix *)0x81eb0c);
  std::allocator<int>::allocator((allocator<int> *)0x81eb59);
  std::vector<int,std::allocator<int>>::vector<int_const*,void>
            (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,in_stack_fffffffffffffd80,
             in_stack_fffffffffffffd78);
  std::allocator<int>::~allocator((allocator<int> *)0x81eb8d);
  std::allocator<int>::allocator((allocator<int> *)0x81ebb2);
  std::vector<int,_std::allocator<int>_>::vector
            (in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
  std::allocator<int>::~allocator((allocator<int> *)0x81ebde);
  std::allocator<int>::allocator((allocator<int> *)0x81ec06);
  std::vector<int,_std::allocator<int>_>::vector
            (in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
  std::allocator<int>::~allocator((allocator<int> *)0x81ec32);
  std::allocator<int>::allocator((allocator<int> *)0x81ec5a);
  std::vector<int,_std::allocator<int>_>::vector
            (in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
  std::allocator<int>::~allocator((allocator<int> *)0x81ec86);
  local_140 = 0;
  local_144 = 0;
  local_150 = local_60;
  local_158._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin(in_stack_fffffffffffffd48);
  local_160 = (int *)std::vector<int,_std::allocator<int>_>::end(in_stack_fffffffffffffd48);
  while (bVar3 = __gnu_cxx::operator!=
                           (in_stack_fffffffffffffd50,
                            (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                             *)in_stack_fffffffffffffd48), bVar3) {
    piVar7 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
             operator*(&local_158);
    iVar2 = *piVar7;
    local_164 = iVar2;
    if (*(int *)(local_38 + (long)iVar2 * 4) != 0) {
      dVar1 = *(double *)(local_20 + (long)iVar2 * 8);
      if ((dVar1 == 0.0) && (!NAN(dVar1))) break;
      Ap_00 = pIVar5;
      Ai_00 = pIVar6;
      jmatch_00 = std::vector<int,_std::allocator<int>_>::data
                            ((vector<int,_std::allocator<int>_> *)0x81ee3e);
      cheap_00 = std::vector<int,_std::allocator<int>_>::data
                           ((vector<int,_std::allocator<int>_> *)0x81ee53);
      marked_00 = std::vector<int,_std::allocator<int>_>::data
                            ((vector<int,_std::allocator<int>_> *)0x81ee68);
      in_stack_fffffffffffffd48 =
           (vector<int,_std::allocator<int>_> *)
           std::vector<int,_std::allocator<int>_>::data
                     ((vector<int,_std::allocator<int>_> *)0x81ee7d);
      in_stack_fffffffffffffd50 =
           (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
           std::vector<int,_std::allocator<int>_>::data
                     ((vector<int,_std::allocator<int>_> *)0x81ee8f);
      work3_00 = std::vector<int,_std::allocator<int>_>::data
                           ((vector<int,_std::allocator<int>_> *)0x81eea1);
      local_165 = AugmentingPath(iVar2,Ap_00,Ai_00,jmatch_00,cheap_00,marked_00,
                                 (Int *)in_stack_fffffffffffffd48,(Int *)in_stack_fffffffffffffd50,
                                 work3_00);
      if ((bool)local_165) {
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd60,work3_00);
        local_140 = local_140 + 1;
      }
      else {
        local_144 = local_144 + 1;
      }
      IVar11 = local_3c;
      iVar2 = local_144;
      sVar8 = std::vector<int,_std::allocator<int>_>::size(local_28);
      iVar10 = IVar11 - (int)sVar8;
      if (SBORROW4(iVar2,iVar10 * 10) == iVar2 + iVar10 * -10 < 0) break;
    }
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&local_158);
  }
  for (local_16c = 0; local_16c < local_3c; local_16c = local_16c + 1) {
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_78,(long)local_16c);
    if (-1 < *pvVar4) {
      *(Int *)(local_30 + (long)local_16c * 4) = local_3c;
    }
  }
  poVar9 = Control::Debug(local_10,1);
  Textline<char[33]>(in_stack_fffffffffffffee8);
  poVar9 = std::operator<<(poVar9,local_190);
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_140);
  poVar9 = std::operator<<(poVar9,'\n');
  Textline<char[32]>((char (*) [32])in_stack_fffffffffffffee8);
  poVar9 = std::operator<<(poVar9,local_1b0);
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_144);
  std::operator<<(poVar9,'\n');
  std::__cxx11::string::~string(local_1b0);
  std::__cxx11::string::~string(local_190);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd60);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd60);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd60);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd60);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd60);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd60);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd60);
  return;
}

Assistant:

static void ProcessRemaining(const Control& control, const Model& model,
                             const double* weights, std::vector<Int>* basis,
                             Int* rownumber, int* active) {
    const Int m = model.rows();
    const Int n = model.cols();
    const SparseMatrix& AI = model.AI();
    const std::vector<Int> colperm = Sortperm(n+m, weights, true);

    // jmatch[i] == -1  if row i is unmatched but eligible for matching
    // jmatch[i] == -2  if row i is excluded from being matched
    // jmatch[i] == j >= 0 if row i is matched to column j
    std::vector<Int> jmatch(m, -1);
    for (Int i = 0; i < m; i++) {
        if (rownumber[i] >= 0)
            jmatch[i] = -2;
    }
    std::vector<Int> marked(n+m, -1);
    const Int* Ap = AI.colptr();
    const Int* Ai = AI.rowidx();
    std::vector<Int> cheap(Ap, Ap+n+m);
    std::vector<Int> work(m), work2(m+1), work3(m+1);
    Int num_matched = 0;
    Int num_failed = 0;

    for (Int j : colperm) {
        if (!active[j])
            continue;
        if (weights[j] == 0.0)
            break;
        bool matched = AugmentingPath(j, Ap, Ai, jmatch.data(), cheap.data(),
                                      marked.data(), work.data(), work2.data(),
                                      work3.data());
        if (matched) {
            basis->push_back(j);
            num_matched++;
        } else {
            num_failed++;
        }
        if (num_failed >= 10*(m-(Int)basis->size()))
            break;
    }
    for (Int i = 0; i < m; i++) {
        if (jmatch[i] >= 0) {
            // rownumber[i] = m indicates that row i was matched
            assert(rownumber[i] < 0);
            rownumber[i] = m;
        }
    }
    control.Debug()
        << Textline("Number of other columns matched:")
        << num_matched << '\n'
        << Textline("Number of other columns failed:")
        << num_failed << '\n';
}